

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O1

void Acec_ManProfile(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  void *__ptr;
  Vec_Wec_t *__ptr_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  timespec ts;
  Vec_Int_t *vXors;
  timespec local_60;
  int local_4c;
  Vec_Int_t *local_48;
  Vec_Wec_t *local_40;
  Vec_Int_t *local_38;
  
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  local_4c = fVerbose;
  pVVar7 = Ree_ManComputeCuts(p,&local_38,fVerbose);
  uVar3 = Ree_ManCountFadds(pVVar7);
  iVar2 = pVVar7->nSize;
  local_48 = pVVar7;
  iVar4 = Ree_ManCountFadds(pVVar7);
  iVar5 = local_38->nSize;
  iVar6 = iVar5 + 3;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  printf("Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ",(ulong)uVar3,
         (ulong)(uint)(iVar2 / 6 - iVar4),(ulong)(uint)(iVar6 >> 2));
  iVar5 = 3;
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%s =","Time");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar11 + lVar8) / 1000000.0);
  iVar5 = clock_gettime(3,&local_60);
  iVar2 = local_4c;
  if (iVar5 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  local_40 = Acec_ManCollectBoxSets(p,local_48,local_38);
  iVar5 = local_40->nSize;
  pcVar9 = "";
  if (9 < iVar5) {
    pcVar9 = "s";
  }
  printf("Detected %d adder-tree%s.  ",(ulong)(uint)(iVar5 / 5),pcVar9);
  iVar4 = 3;
  iVar6 = clock_gettime(3,&local_60);
  if (iVar6 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  Abc_Print(iVar4,"%s =","Time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar11 + lVar8) / 1000000.0);
  if ((iVar2 != 0) && (0 < iVar5)) {
    uVar10 = 0;
    uVar3 = 4;
    do {
      printf("Tree %3d : ",(ulong)uVar10);
      pVVar7 = local_40->pArray;
      printf("Xor = %4d  ",(ulong)(uint)pVVar7[uVar3 - 4].nSize);
      if (iVar5 <= (int)(uVar3 - 3)) {
LAB_00667ca6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      printf("Root = %4d  ",(ulong)(uint)pVVar7[uVar3 - 3].nSize);
      if (iVar5 <= (int)(uVar3 - 2)) goto LAB_00667ca6;
      printf("Adder = %4d  ",(ulong)(uint)pVVar7[uVar3 - 2].nSize);
      uVar1 = uVar3 - 1;
      if (iVar5 <= (int)uVar1) goto LAB_00667ca6;
      printf("In = %4d  ",(ulong)(uint)(pVVar7[uVar1].nSize / 2));
      if (iVar5 <= (int)uVar3) goto LAB_00667ca6;
      printf("Out = %4d  ",(ulong)(uint)(pVVar7[uVar3].nSize / 2));
      putchar(10);
      printf("           Ins:  ");
      Acec_ManPrintRanks(pVVar7 + uVar1);
      printf("           Outs: ");
      Acec_ManPrintRanks(pVVar7 + uVar3);
      uVar10 = uVar10 + 1;
      iVar2 = uVar3 + 1;
      uVar3 = uVar3 + 5;
    } while (iVar2 < iVar5);
  }
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
    local_38->pArray = (int *)0x0;
  }
  __ptr_00 = local_40;
  if (local_38 != (Vec_Int_t *)0x0) {
    free(local_38);
  }
  pVVar7 = local_48;
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  if (pVVar7 != (Vec_Int_t *)0x0) {
    free(pVVar7);
  }
  iVar2 = __ptr_00->nCap;
  if (0 < (long)iVar2) {
    pVVar7 = __ptr_00->pArray;
    lVar8 = 0;
    do {
      __ptr = *(void **)((long)&pVVar7->pArray + lVar8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar7->pArray + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar8);
  }
  if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (Vec_Int_t *)0x0;
  }
  __ptr_00->nCap = 0;
  __ptr_00->nSize = 0;
  free(__ptr_00);
  return;
}

Assistant:

void Acec_ManProfile( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vBoxes; int i;
    Vec_Int_t * vXors, * vAdds = Ree_ManComputeCuts( p, &vXors, fVerbose );

    //Ree_ManPrintAdders( vAdds, 1 );
    printf( "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ", Ree_ManCountFadds(vAdds), Vec_IntSize(vAdds)/6-Ree_ManCountFadds(vAdds), Vec_IntSize(vXors)/4 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vBoxes = Acec_ManCollectBoxSets( p, vAdds, vXors );
    printf( "Detected %d adder-tree%s.  ", Vec_WecSize(vBoxes)/5, Vec_WecSize(vBoxes)/5 > 1 ? "s":"" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( fVerbose )
    for ( i = 0; 5*i < Vec_WecSize(vBoxes); i++ )
    {
        printf( "Tree %3d : ",     i );
        printf( "Xor = %4d  ",     Vec_IntSize(Vec_WecEntry(vBoxes,5*i+0)) );
        printf( "Root = %4d  ",    Vec_IntSize(Vec_WecEntry(vBoxes,5*i+1)) );
        //printf( "(Top = %5d)  ",   Vec_IntEntryLast(Vec_WecEntry(vBoxes,5*i+1)) );
        printf( "Adder = %4d  ",   Vec_IntSize(Vec_WecEntry(vBoxes,5*i+2)) );
        printf( "In = %4d  ",      Vec_IntSize(Vec_WecEntry(vBoxes,5*i+3))/2 );
        printf( "Out = %4d  ",     Vec_IntSize(Vec_WecEntry(vBoxes,5*i+4))/2 );
        printf( "\n" );
        printf( "           Ins:  " );
        Acec_ManPrintRanks( Vec_WecEntry(vBoxes,5*i+3) );
        printf( "           Outs: " );
        Acec_ManPrintRanks( Vec_WecEntry(vBoxes,5*i+4) );
    }

    Vec_IntFree( vXors );
    Vec_IntFree( vAdds );
    Vec_WecFree( vBoxes );
}